

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

void __thiscall Assimp::glTF2Importer::ImportLights(glTF2Importer *this,Asset *r)

{
  int iVar1;
  Light *pLVar2;
  uint uVar3;
  ulong uVar4;
  aiLight **ppaVar5;
  aiLight *this_00;
  float local_54;
  float local_50;
  vec3 colorWithIntensity;
  float local_40;
  aiVector3t<float> local_3c;
  aiLight *local_30;
  aiLight *ail;
  Light *light;
  size_t i;
  Asset *r_local;
  glTF2Importer *this_local;
  
  i = (size_t)r;
  r_local = (Asset *)this;
  uVar3 = glTF2::LazyDict<glTF2::Light>::Size(&r->lights);
  if (uVar3 != 0) {
    uVar3 = glTF2::LazyDict<glTF2::Light>::Size((LazyDict<glTF2::Light> *)(i + 0x460));
    this->mScene->mNumLights = uVar3;
    uVar3 = glTF2::LazyDict<glTF2::Light>::Size((LazyDict<glTF2::Light> *)(i + 0x460));
    uVar4 = SUB168(ZEXT416(uVar3) * ZEXT816(8),0);
    if (SUB168(ZEXT416(uVar3) * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaVar5 = (aiLight **)operator_new__(uVar4);
    this->mScene->mLights = ppaVar5;
    for (light = (Light *)0x0; pLVar2 = light,
        uVar3 = glTF2::LazyDict<glTF2::Light>::Size((LazyDict<glTF2::Light> *)(i + 0x460)),
        pLVar2 < (Light *)(ulong)uVar3;
        light = (Light *)((long)&(light->super_Object)._vptr_Object + 1)) {
      ail = (aiLight *)
            glTF2::LazyDict<glTF2::Light>::operator[]
                      ((LazyDict<glTF2::Light> *)(i + 0x460),(size_t)light);
      this_00 = (aiLight *)operator_new(0x46c);
      aiLight::aiLight(this_00);
      this->mScene->mLights[(long)light] = this_00;
      iVar1 = *(int *)((ail->mName).data + 0x4c);
      if (iVar1 == 0) {
        this_00->mType = aiLightSource_DIRECTIONAL;
      }
      else if (iVar1 == 1) {
        this_00->mType = aiLightSource_POINT;
      }
      else if (iVar1 == 2) {
        this_00->mType = aiLightSource_SPOT;
      }
      local_30 = this_00;
      if (this_00->mType != aiLightSource_POINT) {
        aiVector3t<float>::aiVector3t(&local_3c,0.0,0.0,-1.0);
        (local_30->mDirection).x = local_3c.x;
        (local_30->mDirection).y = local_3c.y;
        (local_30->mDirection).z = local_3c.z;
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)(colorWithIntensity + 1),0.0,1.0,0.0);
        (local_30->mUp).x = colorWithIntensity[1];
        (local_30->mUp).y = colorWithIntensity[2];
        (local_30->mUp).z = local_40;
      }
      local_54 = *(float *)((ail->mName).data + 0x50) * *(float *)((ail->mName).data + 0x5c);
      local_50 = *(float *)((ail->mName).data + 0x54) * *(float *)((ail->mName).data + 0x5c);
      colorWithIntensity[0] =
           *(float *)((ail->mName).data + 0x58) * *(float *)((ail->mName).data + 0x5c);
      glTFCommon::CopyValue((vec3 *)&local_54,&local_30->mColorAmbient);
      glTFCommon::CopyValue((vec3 *)&local_54,&local_30->mColorDiffuse);
      glTFCommon::CopyValue((vec3 *)&local_54,&local_30->mColorSpecular);
      if (local_30->mType == aiLightSource_DIRECTIONAL) {
        local_30->mAttenuationConstant = 1.0;
        local_30->mAttenuationLinear = 0.0;
        local_30->mAttenuationQuadratic = 0.0;
      }
      else {
        local_30->mAttenuationConstant = 0.0;
        local_30->mAttenuationLinear = 0.0;
        local_30->mAttenuationQuadratic = 1.0;
      }
      if (local_30->mType == aiLightSource_SPOT) {
        local_30->mAngleInnerCone = *(float *)((ail->mName).data + 0x68);
        local_30->mAngleOuterCone = *(float *)((ail->mName).data + 0x6c);
      }
    }
  }
  return;
}

Assistant:

void glTF2Importer::ImportLights(glTF2::Asset &r) {
	if (!r.lights.Size())
		return;

	mScene->mNumLights = r.lights.Size();
	mScene->mLights = new aiLight *[r.lights.Size()];

	for (size_t i = 0; i < r.lights.Size(); ++i) {
		Light &light = r.lights[i];

		aiLight *ail = mScene->mLights[i] = new aiLight();

		switch (light.type) {
			case Light::Directional:
				ail->mType = aiLightSource_DIRECTIONAL;
				break;
			case Light::Point:
				ail->mType = aiLightSource_POINT;
				break;
			case Light::Spot:
				ail->mType = aiLightSource_SPOT;
				break;
		}

		if (ail->mType != aiLightSource_POINT) {
			ail->mDirection = aiVector3D(0.0f, 0.0f, -1.0f);
			ail->mUp = aiVector3D(0.0f, 1.0f, 0.0f);
		}

		vec3 colorWithIntensity = { light.color[0] * light.intensity, light.color[1] * light.intensity, light.color[2] * light.intensity };
		CopyValue(colorWithIntensity, ail->mColorAmbient);
		CopyValue(colorWithIntensity, ail->mColorDiffuse);
		CopyValue(colorWithIntensity, ail->mColorSpecular);

		if (ail->mType == aiLightSource_DIRECTIONAL) {
			ail->mAttenuationConstant = 1.0;
			ail->mAttenuationLinear = 0.0;
			ail->mAttenuationQuadratic = 0.0;
		} else {
			//in PBR attenuation is calculated using inverse square law which can be expressed
			//using assimps equation: 1/(att0 + att1 * d + att2 * d*d) with the following parameters
			//this is correct equation for the case when range (see
			//https://github.com/KhronosGroup/glTF/tree/master/extensions/2.0/Khronos/KHR_lights_punctual)
			//is not present. When range is not present it is assumed that it is infinite and so numerator is 1.
			//When range is present then numerator might be any value in range [0,1] and then assimps equation
			//will not suffice. In this case range is added into metadata in ImportNode function
			//and its up to implementation to read it when it wants to
			ail->mAttenuationConstant = 0.0;
			ail->mAttenuationLinear = 0.0;
			ail->mAttenuationQuadratic = 1.0;
		}

		if (ail->mType == aiLightSource_SPOT) {
			ail->mAngleInnerCone = light.innerConeAngle;
			ail->mAngleOuterCone = light.outerConeAngle;
		}
	}
}